

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O3

unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> __thiscall
duckdb::ArrowType::GetArrowLogicalType(ArrowType *this,DBConfig *config,ArrowSchema *schema)

{
  _Head_base<0UL,_duckdb::ArrowType_*,_false> __ptr_00;
  _Head_base<0UL,_duckdb::ArrowType_*,_false> _Var1;
  pointer pAVar2;
  pointer *__ptr;
  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> dictionary;
  _Head_base<0UL,_duckdb::ArrowType_*,_false> local_20;
  
  GetTypeFromSchema(this,config,schema);
  if (schema->dictionary != (ArrowSchema *)0x0) {
    GetArrowLogicalType((ArrowType *)&stack0xffffffffffffffe0,config,schema->dictionary);
    pAVar2 = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::operator->
                       ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                         *)this);
    _Var1._M_head_impl = local_20._M_head_impl;
    local_20._M_head_impl = (ArrowType *)0x0;
    __ptr_00._M_head_impl =
         (pAVar2->dictionary_type).
         super_unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>._M_t.
         super___uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>.
         super__Head_base<0UL,_duckdb::ArrowType_*,_false>._M_head_impl;
    (pAVar2->dictionary_type).
    super_unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>._M_t.
    super___uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>.
    super__Head_base<0UL,_duckdb::ArrowType_*,_false>._M_head_impl = _Var1._M_head_impl;
    if (__ptr_00._M_head_impl != (ArrowType *)0x0) {
      ::std::default_delete<duckdb::ArrowType>::operator()
                ((default_delete<duckdb::ArrowType> *)&pAVar2->dictionary_type,__ptr_00._M_head_impl
                );
      if (local_20._M_head_impl != (ArrowType *)0x0) {
        ::std::default_delete<duckdb::ArrowType>::operator()
                  ((default_delete<duckdb::ArrowType> *)&stack0xffffffffffffffe0,
                   local_20._M_head_impl);
      }
    }
  }
  return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
         (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)this;
}

Assistant:

unique_ptr<ArrowType> ArrowType::GetArrowLogicalType(DBConfig &config, ArrowSchema &schema) {
	auto arrow_type = ArrowType::GetTypeFromSchema(config, schema);
	if (schema.dictionary) {
		auto dictionary = GetArrowLogicalType(config, *schema.dictionary);
		arrow_type->SetDictionary(std::move(dictionary));
	}
	return arrow_type;
}